

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNumberTreeObjectHelper.cc
# Opt level: O1

string * __thiscall
(anonymous_namespace)::NumberTreeDetails::itemsKey_abi_cxx11_(NumberTreeDetails *this)

{
  int iVar1;
  
  if (itemsKey[abi:cxx11]()::k_abi_cxx11_ == '\0') {
    iVar1 = __cxa_guard_acquire(&itemsKey[abi:cxx11]()::k_abi_cxx11_);
    if (iVar1 != 0) {
      itemsKey[abi:cxx11]()::k_abi_cxx11_._M_dataplus._M_p =
           (pointer)&itemsKey[abi:cxx11]()::k_abi_cxx11_.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&itemsKey[abi:cxx11]()::k_abi_cxx11_,"/Nums","");
      __cxa_atexit(std::__cxx11::string::~string,&itemsKey[abi:cxx11]()::k_abi_cxx11_,&__dso_handle)
      ;
      __cxa_guard_release(&itemsKey[abi:cxx11]()::k_abi_cxx11_);
    }
  }
  return &itemsKey[abi:cxx11]()::k_abi_cxx11_;
}

Assistant:

std::string const&
        itemsKey() const override
        {
            static std::string k("/Nums");
            return k;
        }